

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suprun.c
# Opt level: O0

void supivoc1(supcxdef *sup,voccxdef *ctx,vocidef *v,objnum target,int inh_from_obj,int flags)

{
  undefined2 in_CX;
  voccxdef *in_RDX;
  supcxdef *in_RSI;
  undefined8 in_RDI;
  int in_R8D;
  undefined4 in_R9D;
  voccxdef *unaff_retaddr;
  char buf [40];
  vocidef *scv;
  int numsc;
  objnum *sc;
  tokthdef *in_stack_ffffffffffffff78;
  tokthdef *in_stack_ffffffffffffff80;
  errcxdef *peVar1;
  int err;
  errcxdef *in_stack_ffffffffffffff98;
  mcmcxdef *in_stack_ffffffffffffffa0;
  uint local_34;
  ushort *puVar2;
  int in_stack_ffffffffffffffd8;
  undefined2 in_stack_ffffffffffffffe4;
  
  puVar2 = (ushort *)((long)&in_RDX->voccxtio + 6);
  for (local_34 = (uint)*(byte *)&in_RDX->voccxerr; local_34 != 0; local_34 = local_34 - 1) {
    peVar1 = (&(&in_RSI[1].supcxrun)[(int)(uint)*puVar2 >> 8]->runcxerr)[(int)(*puVar2 & 0xff)];
    if (peVar1 == (errcxdef *)0x0) {
      supgnam((char *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,0);
      in_stack_ffffffffffffff80 = in_RSI->supcxtab;
      peVar1 = in_RSI->supcxerr;
      err = (int)((ulong)&stack0xffffffffffffff98 >> 0x20);
      strlen(&stack0xffffffffffffff98);
      sup_log_undefobj(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,err,(char *)peVar1,
                       (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                       (objnum)((ulong)in_stack_ffffffffffffff80 >> 0x10));
    }
    else {
      supivoc1(in_RSI,in_RDX,(vocidef *)CONCAT26(in_CX,CONCAT24(in_stack_ffffffffffffffe4,in_R8D)),
               (objnum)((uint)in_R9D >> 0x10),in_stack_ffffffffffffffd8,(int)((ulong)puVar2 >> 0x20)
              );
      if ((((ulong)peVar1->errcxlog & 1) != 0) && (*(short *)((long)&in_RDX->voccxtio + 4) == -1)) {
        if (*(short *)((long)&peVar1->errcxlog + 2) == -1) {
          *(undefined2 *)((long)&in_RDX->voccxtio + 4) =
               *(undefined2 *)((long)&peVar1->errcxlog + 4);
        }
        else {
          *(undefined2 *)((long)&in_RDX->voccxtio + 4) =
               *(undefined2 *)((long)&peVar1->errcxlog + 2);
        }
      }
      if (((in_R8D != 0) || (((ulong)peVar1->errcxlog & 1) != 0)) &&
         (((ulong)peVar1->errcxlog & 2) != 0)) {
        supiwrds(unaff_retaddr,(objnum)((ulong)in_RDI >> 0x30),(objnum)((ulong)in_RDI >> 0x20),
                 (int)in_RDI);
      }
    }
    puVar2 = puVar2 + 1;
  }
  return;
}

Assistant:

void supivoc1(supcxdef *sup, voccxdef *ctx, vocidef *v, objnum target,
              int inh_from_obj, int flags)
{
    objnum   *sc;
    int       numsc;
    vocidef  *scv;
    
    for (numsc = v->vocinsc, sc = v->vocisc ; numsc ; ++sc, --numsc)
    {
        scv = vocinh(ctx, *sc);
        if (scv)
        {
            /* inherit from its superclasses first */
            supivoc1(sup, ctx, scv, target, FALSE, flags);
            
            /* if it's a class object, we can inherit from it */
            if (scv->vociflg & VOCIFCLASS)
            {
                /* inherit location, if we haven't already done so */
                if (v->vociilc == MCMONINV)
                {
                    if (scv->vociloc == MCMONINV)
                        v->vociilc = scv->vociilc;
                    else
                        v->vociilc = scv->vociloc;
                }
            }

            /*
             *   inherit from superclass if it's a class, or if we're
             *   supposed to inherit from any object 
             */
            if (inh_from_obj || (scv->vociflg & VOCIFCLASS))
            {
                /* inherit vocabulary if this superclass has any words */
                if (scv->vociflg & VOCIFVOC)
                    supiwrds(ctx, *sc, target, flags);
            }
        }
        else
        {
            char  buf[TOKNAMMAX + 1];

            /* get the symbol's name */
            supgnam(buf, sup->supcxtab, *sc);

            /* log an error with the symbol's name and location of first use */
            sup_log_undefobj(ctx->voccxmem, ctx->voccxerr, ERR_UNDFOBJ,
                             buf, (int)strlen(buf), *sc);
        }
    }    
}